

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crate-format.cc
# Opt level: O0

expected<tinyusdz::crate::CrateDataType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* __thiscall
tinyusdz::crate::GetCrateDataType_abi_cxx11_
          (expected<tinyusdz::crate::CrateDataType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,crate *this,int32_t type_id)

{
  bool bVar1;
  size_t sVar2;
  value_type *pvVar3;
  char *s;
  ParseState *value;
  ParseState *value_00;
  CrateDataTypeId did;
  undefined1 local_590 [8];
  CrateDataType dst;
  undefined1 local_578 [7];
  bool supports_array;
  expected_lite local_558 [32];
  unexpected_type<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_conflict
  local_538;
  iterator<mapbox::eternal::impl::element<tinyusdz::crate::CrateDataTypeId,_mapbox::eternal::string>_>
  local_518;
  CrateDataTypeId local_50c;
  iterator<mapbox::eternal::impl::element<tinyusdz::crate::CrateDataTypeId,_mapbox::eternal::string>_>
  local_508;
  const_iterator tyret;
  expected_lite local_4e0 [32];
  unexpected_type<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_conflict
  local_4c0;
  undefined1 local_4a0 [8];
  map<mapbox::eternal::impl::element<tinyusdz::crate::CrateDataTypeId,_bool>,_31UL> arrmap;
  map<mapbox::eternal::impl::element<tinyusdz::crate::CrateDataTypeId,_mapbox::eternal::string>,_57UL>
  tymap;
  int32_t type_id_local;
  
  did = (CrateDataTypeId)this;
  memcpy(arrmap.data_ + 0x1e,&DAT_00707b20,0x390);
  memcpy(local_4a0,&DAT_005934b8,0xf8);
  if ((int)did < 0) {
    ::std::__cxx11::to_string((string *)&tyret,did);
    ::std::operator+((char *)local_4e0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     "Unknown type id: ");
    nonstd::expected_lite::make_unexpected<std::__cxx11::string>
              ((unexpected_type<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&local_4c0,local_4e0,value);
    nonstd::expected_lite::
    expected<tinyusdz::crate::CrateDataType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::expected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              (__return_storage_ptr__,&local_4c0);
    nonstd::expected_lite::
    unexpected_type<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~unexpected_type((unexpected_type<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_4c0);
    ::std::__cxx11::string::~string((string *)local_4e0);
    ::std::__cxx11::string::~string((string *)&tyret);
  }
  else {
    local_50c = did;
    local_508.pos =
         (element<tinyusdz::crate::CrateDataTypeId,_mapbox::eternal::string> *)
         mapbox::eternal::impl::
         map<mapbox::eternal::impl::element<tinyusdz::crate::CrateDataTypeId,_mapbox::eternal::string>,_57UL>
         ::find((map<mapbox::eternal::impl::element<tinyusdz::crate::CrateDataTypeId,_mapbox::eternal::string>,_57UL>
                 *)(arrmap.data_ + 0x1e),&local_50c);
    local_518.pos =
         (element<tinyusdz::crate::CrateDataTypeId,_mapbox::eternal::string> *)
         mapbox::eternal::impl::
         map<mapbox::eternal::impl::element<tinyusdz::crate::CrateDataTypeId,_mapbox::eternal::string>,_57UL>
         ::end((map<mapbox::eternal::impl::element<tinyusdz::crate::CrateDataTypeId,_mapbox::eternal::string>,_57UL>
                *)(arrmap.data_ + 0x1e));
    bVar1 = mapbox::eternal::
            iterator<mapbox::eternal::impl::element<tinyusdz::crate::CrateDataTypeId,_mapbox::eternal::string>_>
            ::operator==(&local_508,&local_518);
    if (bVar1) {
      ::std::__cxx11::to_string((string *)local_578,did);
      ::std::operator+((char *)local_558,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       "Unknown or unspported type id: ");
      nonstd::expected_lite::make_unexpected<std::__cxx11::string>
                ((unexpected_type<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_538,local_558,value_00);
      nonstd::expected_lite::
      expected<tinyusdz::crate::CrateDataType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::expected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                (__return_storage_ptr__,&local_538);
      nonstd::expected_lite::
      unexpected_type<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~unexpected_type((unexpected_type<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_538);
      ::std::__cxx11::string::~string((string *)local_558);
      ::std::__cxx11::string::~string((string *)local_578);
    }
    else {
      dst.dtype_id = did;
      sVar2 = mapbox::eternal::impl::
              map<mapbox::eternal::impl::element<tinyusdz::crate::CrateDataTypeId,_bool>,_31UL>::
              count((map<mapbox::eternal::impl::element<tinyusdz::crate::CrateDataTypeId,_bool>,_31UL>
                     *)local_4a0,&dst.dtype_id);
      dst._15_1_ = sVar2 != 0;
      pvVar3 = mapbox::eternal::
               iterator<mapbox::eternal::impl::element<tinyusdz::crate::CrateDataTypeId,_mapbox::eternal::string>_>
               ::operator->(&local_508);
      s = mapbox::eternal::string::data(&pvVar3->second);
      CrateDataType::CrateDataType((CrateDataType *)local_590,s,did,(bool)(dst._15_1_ & 1));
      nonstd::expected_lite::
      expected<tinyusdz::crate::CrateDataType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::expected<tinyusdz::crate::CrateDataType,_0>
                (__return_storage_ptr__,(CrateDataType *)local_590);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

nonstd::expected<CrateDataType, std::string> GetCrateDataType(int32_t type_id) {
  // See <pxrUSD>/pxr/usd/usd/crateDataTypes.h

  // TODO: Use type name in value-types.hh and prim-types.hh?
  MAPBOX_ETERNAL_CONSTEXPR const auto tymap =
      mapbox::eternal::map<CrateDataTypeId, mapbox::eternal::string>({
          {CrateDataTypeId::CRATE_DATA_TYPE_INVALID, "Invalid"},  // 0
          {CrateDataTypeId::CRATE_DATA_TYPE_BOOL, "Bool"},
          {CrateDataTypeId::CRATE_DATA_TYPE_UCHAR, "UChar"},
          {CrateDataTypeId::CRATE_DATA_TYPE_INT, "Int"},
          {CrateDataTypeId::CRATE_DATA_TYPE_UINT, "UInt"},
          {CrateDataTypeId::CRATE_DATA_TYPE_INT64, "Int64"},
          {CrateDataTypeId::CRATE_DATA_TYPE_UINT64, "UInt64"},

          {CrateDataTypeId::CRATE_DATA_TYPE_HALF, "Half"},
          {CrateDataTypeId::CRATE_DATA_TYPE_FLOAT, "Float"},
          {CrateDataTypeId::CRATE_DATA_TYPE_DOUBLE, "Double"},

          {CrateDataTypeId::CRATE_DATA_TYPE_STRING, "String"},
          {CrateDataTypeId::CRATE_DATA_TYPE_TOKEN, "Token"},
          {CrateDataTypeId::CRATE_DATA_TYPE_ASSET_PATH, "AssetPath"},

          {CrateDataTypeId::CRATE_DATA_TYPE_MATRIX2D, "Matrix2d"},
          {CrateDataTypeId::CRATE_DATA_TYPE_MATRIX3D, "Matrix3d"},
          {CrateDataTypeId::CRATE_DATA_TYPE_MATRIX4D, "Matrix4d"},

          {CrateDataTypeId::CRATE_DATA_TYPE_QUATD, "Quatd"},
          {CrateDataTypeId::CRATE_DATA_TYPE_QUATF, "Quatf"},
          {CrateDataTypeId::CRATE_DATA_TYPE_QUATH, "Quath"},

          {CrateDataTypeId::CRATE_DATA_TYPE_VEC2D, "Vec2d"},
          {CrateDataTypeId::CRATE_DATA_TYPE_VEC2F, "Vec2f"},
          {CrateDataTypeId::CRATE_DATA_TYPE_VEC2H, "Vec2h"},
          {CrateDataTypeId::CRATE_DATA_TYPE_VEC2I, "Vec2i"},

          {CrateDataTypeId::CRATE_DATA_TYPE_VEC3D, "Vec3d"},
          {CrateDataTypeId::CRATE_DATA_TYPE_VEC3F, "Vec3f"},
          {CrateDataTypeId::CRATE_DATA_TYPE_VEC3H, "Vec3h"},
          {CrateDataTypeId::CRATE_DATA_TYPE_VEC3I, "Vec3i"},

          {CrateDataTypeId::CRATE_DATA_TYPE_VEC4D, "Vec4d"},
          {CrateDataTypeId::CRATE_DATA_TYPE_VEC4F, "Vec4f"},
          {CrateDataTypeId::CRATE_DATA_TYPE_VEC4H, "Vec4h"},
          {CrateDataTypeId::CRATE_DATA_TYPE_VEC4I, "Vec4i"},

          // Non-array types.
          {CrateDataTypeId::CRATE_DATA_TYPE_DICTIONARY, "Dictionary"},
          {CrateDataTypeId::CRATE_DATA_TYPE_TOKEN_LIST_OP, "TokenListOp"},
          {CrateDataTypeId::CRATE_DATA_TYPE_STRING_LIST_OP, "StringListOp"},
          {CrateDataTypeId::CRATE_DATA_TYPE_PATH_LIST_OP, "PathListOp"},
          {CrateDataTypeId::CRATE_DATA_TYPE_REFERENCE_LIST_OP,
           "ReferenceListOp"},
          {CrateDataTypeId::CRATE_DATA_TYPE_INT_LIST_OP, "IntListOp"},
          {CrateDataTypeId::CRATE_DATA_TYPE_INT64_LIST_OP, "Int64ListOp"},
          {CrateDataTypeId::CRATE_DATA_TYPE_UINT_LIST_OP, "UIntListOp"},
          {CrateDataTypeId::CRATE_DATA_TYPE_UINT64_LIST_OP, "UInt64ListOp"},

          {CrateDataTypeId::CRATE_DATA_TYPE_PATH_VECTOR, "PathVector"},
          {CrateDataTypeId::CRATE_DATA_TYPE_TOKEN_VECTOR, "TokenVector"},
          {CrateDataTypeId::CRATE_DATA_TYPE_SPECIFIER, "Specifier"},
          {CrateDataTypeId::CRATE_DATA_TYPE_PERMISSION, "Permission"},
          {CrateDataTypeId::CRATE_DATA_TYPE_VARIABILITY, "Variability"},

          {CrateDataTypeId::CRATE_DATA_TYPE_VARIANT_SELECTION_MAP,
           "VariantSelectionMap"},
          {CrateDataTypeId::CRATE_DATA_TYPE_TIME_SAMPLES, "TimeSamples"},
          {CrateDataTypeId::CRATE_DATA_TYPE_PAYLOAD, "Payload"},
          {CrateDataTypeId::CRATE_DATA_TYPE_DOUBLE_VECTOR, "DoubleVector"},
          {CrateDataTypeId::CRATE_DATA_TYPE_LAYER_OFFSET_VECTOR,
           "LayerOffsetVector"},
          {CrateDataTypeId::CRATE_DATA_TYPE_STRING_VECTOR, "StringVector"},
          {CrateDataTypeId::CRATE_DATA_TYPE_VALUE_BLOCK, "ValueBlock"},
          {CrateDataTypeId::CRATE_DATA_TYPE_VALUE, "Value"},
          {CrateDataTypeId::CRATE_DATA_TYPE_UNREGISTERED_VALUE,
           "UnregisteredValue"},
          {CrateDataTypeId::CRATE_DATA_TYPE_UNREGISTERED_VALUE_LIST_OP,
           "UnregisteredValueListOp"},
          {CrateDataTypeId::CRATE_DATA_TYPE_PAYLOAD_LIST_OP, "PayloadListOp"},
          {CrateDataTypeId::CRATE_DATA_TYPE_TIME_CODE, "TimeCode"},
      });

  // List up `supports array` type.
  // TODO: Use compile-time `set`
  MAPBOX_ETERNAL_CONSTEXPR const auto arrmap =
      mapbox::eternal::map<CrateDataTypeId, bool>({
          {CrateDataTypeId::CRATE_DATA_TYPE_BOOL, true},
          {CrateDataTypeId::CRATE_DATA_TYPE_UCHAR, true},
          {CrateDataTypeId::CRATE_DATA_TYPE_INT, true},
          {CrateDataTypeId::CRATE_DATA_TYPE_UINT, true},
          {CrateDataTypeId::CRATE_DATA_TYPE_INT64, true},
          {CrateDataTypeId::CRATE_DATA_TYPE_UINT64, true},

          {CrateDataTypeId::CRATE_DATA_TYPE_HALF, true},
          {CrateDataTypeId::CRATE_DATA_TYPE_FLOAT, true},
          {CrateDataTypeId::CRATE_DATA_TYPE_DOUBLE, true},

          {CrateDataTypeId::CRATE_DATA_TYPE_STRING, true},
          {CrateDataTypeId::CRATE_DATA_TYPE_TOKEN, true},
          {CrateDataTypeId::CRATE_DATA_TYPE_ASSET_PATH, true},

          {CrateDataTypeId::CRATE_DATA_TYPE_MATRIX2D, true},
          {CrateDataTypeId::CRATE_DATA_TYPE_MATRIX3D, true},
          {CrateDataTypeId::CRATE_DATA_TYPE_MATRIX4D, true},

          {CrateDataTypeId::CRATE_DATA_TYPE_QUATD, true},
          {CrateDataTypeId::CRATE_DATA_TYPE_QUATF, true},
          {CrateDataTypeId::CRATE_DATA_TYPE_QUATH, true},

          {CrateDataTypeId::CRATE_DATA_TYPE_VEC2D, true},
          {CrateDataTypeId::CRATE_DATA_TYPE_VEC2F, true},
          {CrateDataTypeId::CRATE_DATA_TYPE_VEC2H, true},
          {CrateDataTypeId::CRATE_DATA_TYPE_VEC2I, true},

          {CrateDataTypeId::CRATE_DATA_TYPE_VEC3D, true},
          {CrateDataTypeId::CRATE_DATA_TYPE_VEC3F, true},
          {CrateDataTypeId::CRATE_DATA_TYPE_VEC3H, true},
          {CrateDataTypeId::CRATE_DATA_TYPE_VEC3I, true},

          {CrateDataTypeId::CRATE_DATA_TYPE_VEC4D, true},
          {CrateDataTypeId::CRATE_DATA_TYPE_VEC4F, true},
          {CrateDataTypeId::CRATE_DATA_TYPE_VEC4H, true},
          {CrateDataTypeId::CRATE_DATA_TYPE_VEC4I, true},
          {CrateDataTypeId::CRATE_DATA_TYPE_TIME_CODE, true},
      });

  if (type_id < 0) {
    return nonstd::make_unexpected("Unknown type id: " +
                                   std::to_string(type_id));
  }

  auto tyret = tymap.find(static_cast<CrateDataTypeId>(type_id));

  if (tyret == tymap.end()) {
    // Invalid or unsupported.
    return nonstd::make_unexpected("Unknown or unspported type id: " +
                                   std::to_string(type_id));
  }

  bool supports_array = arrmap.count(static_cast<CrateDataTypeId>(type_id));

  CrateDataType dst(tyret->second.data(), static_cast<CrateDataTypeId>(type_id),
                    supports_array);

  return std::move(dst);
}